

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O3

void GetBinaryPathWithFileNameA(char *path,size_t buffer_size,char *filename)

{
  uchar uVar1;
  char *pcVar2;
  uchar *puVar3;
  ulong uVar4;
  size_t __n;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  char local_368 [8];
  char modulename [260];
  char local_258 [8];
  char fullpath [260];
  uchar local_148;
  uchar local_147 [7];
  char dir [256];
  char local_33 [8];
  char drive [3];
  
  pcVar8 = local_368;
  PlatformAgnostic::SystemInfo::GetBinaryLocation(pcVar8,0x104);
  if (local_368[0] == '\\') {
    if ((local_368[1] == '\\') && (local_368[2] == '?')) {
      pcVar8 = local_368 + (ulong)(local_368[3] == '\\') * 4;
      local_368[0] = *pcVar8;
      goto LAB_0010dab7;
    }
LAB_0010dac0:
    if (local_368[1] != ':') goto LAB_0010dae0;
    strncpy_s(local_33,3,pcVar8,2);
    pcVar8 = pcVar8 + 2;
  }
  else {
LAB_0010dab7:
    if (local_368[0] != '\0') {
      local_368[1] = pcVar8[1];
      goto LAB_0010dac0;
    }
LAB_0010dae0:
    local_33[0] = '\0';
    local_33[1] = -3;
    local_33[2] = -3;
  }
  pcVar2 = (char *)0x0;
  pcVar6 = pcVar8;
  do {
    do {
      pcVar5 = pcVar2;
      pcVar2 = pcVar6 + 1;
      cVar7 = *pcVar6;
      pcVar6 = pcVar2;
    } while (cVar7 == '/');
  } while ((cVar7 == '\\') || (pcVar2 = pcVar5, cVar7 != '\0'));
  if (pcVar5 == (char *)0x0) {
    local_148 = '\0';
    memset(local_147,0xfd,0xff);
  }
  else if ((ulong)((long)pcVar5 - (long)pcVar8) < 0x100) {
    strncpy_s((char *)&local_148,0x100,pcVar8,(long)pcVar5 - (long)pcVar8);
  }
  else {
    local_33[0] = '\0';
    local_33[1] = -3;
    local_33[2] = -3;
    local_148 = '\0';
    memset(local_147,0xfd,0xff);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  if (local_33[0] == '\0') {
    pcVar8 = local_258;
    uVar9 = 0;
  }
  else {
    pcVar8 = local_258 + 2;
    local_258[0] = local_33[0];
    local_258[1] = 0x3a;
    uVar9 = 2;
  }
  uVar4 = uVar9;
  pcVar6 = pcVar8;
  if (local_148 != '\0') {
    lVar11 = 0;
    uVar1 = local_148;
    do {
      lVar10 = lVar11;
      if (lVar10 + uVar9 == 0x103) goto LAB_0010dc88;
      pcVar8[lVar10] = uVar1;
      uVar1 = local_147[lVar10];
      lVar11 = lVar10 + 1;
    } while (uVar1 != '\0');
    puVar3 = _mbsdec(&local_148,local_147 + lVar10);
    uVar4 = lVar11 + uVar9;
    pcVar6 = pcVar8 + lVar11;
    if ((*puVar3 != '/') && (*puVar3 != '\\')) {
      if (lVar11 + uVar9 == 0x103) {
LAB_0010dc88:
        local_258[0] = '\0';
        memset(local_258 + 1,0xfd,0x103);
        RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
        goto LAB_0010dcb2;
      }
      pcVar8[lVar11] = '\\';
      uVar4 = lVar11 + uVar9 + 1;
      pcVar6 = pcVar8 + lVar11 + 1;
    }
  }
  if ((filename != (char *)0x0) && (cVar7 = *filename, cVar7 != '\0')) {
    pcVar8 = filename + 1;
    do {
      if (0x102 < uVar4) goto LAB_0010dc88;
      uVar4 = uVar4 + 1;
      *pcVar6 = cVar7;
      pcVar6 = pcVar6 + 1;
      cVar7 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar7 != '\0');
  }
  *pcVar6 = '\0';
  if (uVar4 < 0x103) {
    memset(local_258 + uVar4 + 1,0xfd,0x103 - uVar4);
  }
LAB_0010dcb2:
  __n = strlen(local_258);
  if (__n < buffer_size) {
    memcpy(path,local_258,__n);
  }
  else {
    __n = 0;
  }
  path[__n] = '\0';
  return;
}

Assistant:

void GetBinaryPathWithFileNameA(char *path, const size_t buffer_size, const char* filename)
{
    char fullpath[_MAX_PATH];
    char drive[_MAX_DRIVE];
    char dir[_MAX_DIR];

    char modulename[_MAX_PATH];
    PlatformAgnostic::SystemInfo::GetBinaryLocation(modulename, _MAX_PATH);
    _splitpath_s(modulename, drive, _MAX_DRIVE, dir, _MAX_DIR, nullptr, 0, nullptr, 0);
    _makepath_s(fullpath, drive, dir, filename, nullptr);

    size_t len = strlen(fullpath);
    if (len < buffer_size)
    {
        memcpy(path, fullpath, len * sizeof(char));
    }
    else
    {
        len = 0;
    }
    path[len] = char(0);
}